

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O2

BN * __thiscall
BN::expSlidingWindow
          (BN *__return_storage_ptr__,BN *this,BN *exponent,BN *mod,
          vector<BN,_std::allocator<BN>_> *g,size_t K)

{
  bool bVar1;
  size_t sVar2;
  int iVar3;
  size_t index;
  uint uVar4;
  uint uVar5;
  size_t index_00;
  int iVar6;
  long lVar7;
  int local_68;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_60;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_48;
  
  bn1();
  sVar2 = bitCount(exponent);
  while( true ) {
    uVar4 = (int)sVar2 - 1;
    sVar2 = (size_t)uVar4;
    if ((int)uVar4 < 0) break;
    index_00 = (size_t)uVar4;
    bVar1 = bitI(exponent,index_00);
    if (bVar1) {
      local_68 = (int)K;
      sVar2 = (size_t)(uVar4 - local_68);
      if ((int)(uVar4 - local_68) < 0) {
        sVar2 = 0xffffffff;
      }
      index = (size_t)(int)sVar2;
      lVar7 = (index << 0x20) + -0x100000000;
      do {
        index = index + 1;
        lVar7 = lVar7 + 0x100000000;
        bVar1 = bitI(exponent,index);
        uVar5 = (int)sVar2 + 1;
        sVar2 = (size_t)uVar5;
      } while (!bVar1);
      iVar3 = 0;
      for (; lVar7 >> 0x20 < (long)index_00; index_00 = index_00 - 1) {
        bVar1 = bitI(exponent,index_00);
        iVar3 = (uint)bVar1 + iVar3 * 2;
      }
      for (iVar6 = 0; iVar6 <= (int)(uVar4 - uVar5); iVar6 = iVar6 + 1) {
        Qrt((BN *)&local_48,__return_storage_ptr__);
        operator%((BN *)&local_60,(BN *)&local_48,mod);
        operator=(__return_storage_ptr__,(BN *)&local_60);
        std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_60)
        ;
        std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_48)
        ;
      }
      karatsubaMultiplication
                ((BN *)&local_48,__return_storage_ptr__,
                 (g->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.super__Vector_impl_data.
                 _M_start + iVar3);
      operator%((BN *)&local_60,(BN *)&local_48,mod);
      operator=(__return_storage_ptr__,(BN *)&local_60);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_60);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_48);
    }
    else {
      Qrt((BN *)&local_48,__return_storage_ptr__);
      operator%((BN *)&local_60,(BN *)&local_48,mod);
      operator=(__return_storage_ptr__,(BN *)&local_60);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_60);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BN BN::expSlidingWindow(const BN& exponent, const BN& mod, const vector<BN>& g, size_t K) const {
    BN A(BN::bn1());
    int i = exponent.bitCount() - 1;
    while (i >= 0) {
        if(exponent.bitI(i) == 0) {
            A = A.Qrt() % mod;
            i--;
            continue;
        }
        int l = max(i - static_cast<int>(K) + 1, 0);
        while(exponent.bitI(l) == 0)
            l++;

        int gx = 0;
        for(int j = i; j >= l; j--)
            gx = (gx << 1) | exponent.bitI(j);
        for(int j = 0; j < i - l + 1; j++)
            A = A.Qrt() % mod;
        A = A * g[gx] % mod;
        i = l - 1;
    }
    return A;
}